

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::TimerImpl::Impl> kj::heap<kj::TimerImpl::Impl>(void)

{
  Impl *this;
  Impl *extraout_RDX;
  Own<kj::TimerImpl::Impl> *in_RDI;
  Own<kj::TimerImpl::Impl> OVar1;
  
  this = (Impl *)operator_new(0x30);
  memset(this,0,0x30);
  TimerImpl::Impl::Impl(this);
  Own<kj::TimerImpl::Impl>::Own
            (in_RDI,this,(Disposer *)&_::HeapDisposer<kj::TimerImpl::Impl>::instance);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)in_RDI;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}